

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::erase
          (Data<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *this,Bucket bucket)

{
  byte bVar1;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *pSVar2;
  size_t sVar3;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *pSVar4;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *pSVar5;
  size_t bucket_00;
  ulong uVar6;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *this_00;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node> *this_01;
  size_t fromIndex;
  QByteArrayView key;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    uVar6 = (ulong)bVar1;
    if (uVar6 != 0xff) {
      key.m_data = *(storage_type **)(this_00->entries[uVar6].storage.data + 0x18);
      key.m_size = *(qsizetype *)(this_00->entries[uVar6].storage.data + 0x20);
      sVar3 = ::qHash(key,this->seed);
      uVar6 = this->numBuckets - 1 & sVar3;
      pSVar4 = pSVar2 + (uVar6 >> 7);
      uVar6 = (ulong)((uint)uVar6 & 0x7f);
      if (uVar6 != fromIndex || pSVar4 != this_00) {
        do {
          if ((pSVar4 == this_01) && (uVar6 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            else {
              Span<QCache<QByteArray,_QTzTimeZoneCacheEntry>::Node>::moveFromSpan
                        (this_01,this_00,fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            break;
          }
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar4 = pSVar5;
            }
            uVar6 = 0;
          }
        } while ((pSVar4 != this_00) || (uVar6 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }